

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

bool boost::operator<(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a,
                     dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_type i;
  long lVar5;
  bool bVar6;
  
  uVar4 = a->m_num_bits;
  if (uVar4 != b->m_num_bits) {
    __assert_fail("a.size() == b.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x573,
                  "bool boost::operator<(const dynamic_bitset<Block, Allocator> &, const dynamic_bitset<Block, Allocator> &) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  puVar1 = (a->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(a->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  do {
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar6) {
      return false;
    }
    uVar2 = puVar1[lVar5];
    uVar3 = (b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    bVar6 = (bool)((byte)uVar4 & uVar2 <= uVar3 | uVar2 < uVar3);
    uVar4 = (ulong)bVar6;
  } while (uVar2 == uVar3);
  return bVar6;
}

Assistant:

bool operator<(const dynamic_bitset<Block, Allocator>& a,
               const dynamic_bitset<Block, Allocator>& b)
{
    assert(a.size() == b.size());
    typedef typename dynamic_bitset<Block, Allocator>::size_type size_type;

    //if (a.size() == 0)
    //  return false;

    // Since we are storing the most significant bit
    // at pos == size() - 1, we need to do the comparisons in reverse.
    //
    for (size_type ii = a.num_blocks(); ii > 0; --ii) {
      size_type i = ii-1;
      if (a.m_bits[i] < b.m_bits[i])
        return true;
      else if (a.m_bits[i] > b.m_bits[i])
        return false;
    }
    return false;
}